

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_RsbFree(Gia_RsbMan_t *p)

{
  int *piVar1;
  Vec_Wec_t *pVVar2;
  void *pvVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  pVVar5 = p->vActive;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vObjs;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vObjs2;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar2 = p->vSets[0];
  iVar4 = pVVar2->nCap;
  pVVar5 = pVVar2->pArray;
  if (iVar4 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_007c6a06;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar5 = pVVar2->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar2->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
LAB_007c6a06:
    free(pVVar5);
  }
  free(pVVar2);
  pVVar2 = p->vSets[1];
  iVar4 = pVVar2->nCap;
  pVVar5 = pVVar2->pArray;
  if (iVar4 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_007c6a66;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar5 = pVVar2->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar2->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
  }
  free(pVVar5);
LAB_007c6a66:
  free(pVVar2);
  if (p->pSet[0] != (word *)0x0) {
    free(p->pSet[0]);
    p->pSet[0] = (word *)0x0;
  }
  if (p->pSet[1] != (word *)0x0) {
    free(p->pSet[1]);
    p->pSet[1] = (word *)0x0;
  }
  if (p->pSet[2] != (word *)0x0) {
    free(p->pSet[2]);
  }
  free(p);
  return;
}

Assistant:

void Gia_RsbFree( Gia_RsbMan_t * p )
{
    Vec_IntFree( p->vActive );
    Vec_IntFree( p->vObjs );
    Vec_IntFree( p->vObjs2 );
    Vec_WecFree( p->vSets[0] );
    Vec_WecFree( p->vSets[1] );
    ABC_FREE( p->pSet[0] );
    ABC_FREE( p->pSet[1] );
    ABC_FREE( p->pSet[2] );
    ABC_FREE( p );
}